

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BZ2_hbAssignCodes(Int32 *code,UChar *length,Int32 minLen,Int32 maxLen,Int32 alphaSize)

{
  int local_30;
  int local_2c;
  Int32 i;
  Int32 vec;
  Int32 n;
  Int32 alphaSize_local;
  Int32 maxLen_local;
  Int32 minLen_local;
  UChar *length_local;
  Int32 *code_local;
  
  local_2c = 0;
  for (i = minLen; i <= maxLen; i = i + 1) {
    for (local_30 = 0; local_30 < alphaSize; local_30 = local_30 + 1) {
      if ((uint)length[local_30] == i) {
        code[local_30] = local_2c;
        local_2c = local_2c + 1;
      }
    }
    local_2c = local_2c << 1;
  }
  return;
}

Assistant:

void BZ2_hbAssignCodes ( Int32 *code,
                         UChar *length,
                         Int32 minLen,
                         Int32 maxLen,
                         Int32 alphaSize )
{
   Int32 n, vec, i;

   vec = 0;
   for (n = minLen; n <= maxLen; n++) {
      for (i = 0; i < alphaSize; i++)
         if (length[i] == n) { code[i] = vec; vec++; };
      vec <<= 1;
   }
}